

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O3

bool __thiscall QGraphicsItem::hasFocus(QGraphicsItem *this)

{
  QGraphicsScene *this_00;
  QGraphicsItemPrivate *pQVar1;
  long lVar2;
  bool bVar3;
  QGraphicsItem *pQVar4;
  
  do {
    pQVar4 = this;
    this_00 = (QGraphicsScene *)((pQVar4->d_ptr).d)->scene;
    if ((this_00 == (QGraphicsScene *)0x0) || (bVar3 = QGraphicsScene::isActive(this_00), !bVar3))
    goto LAB_005d8a49;
    pQVar1 = (pQVar4->d_ptr).d;
    this = pQVar1->focusProxy;
  } while (this != (QGraphicsItem *)0x0);
  lVar2 = *(long *)&pQVar1->scene->field_0x8;
  if (*(QGraphicsItem **)(lVar2 + 0x188) == pQVar4) {
    do {
      pQVar1 = (pQVar4->d_ptr).d;
      if ((pQVar1->field_0x165 & 0x40) != 0) goto LAB_005d8a6a;
      pQVar4 = pQVar1->parent;
    } while (pQVar4 != (QGraphicsItem *)0x0);
    pQVar4 = (QGraphicsItem *)0x0;
LAB_005d8a6a:
    bVar3 = pQVar4 == *(QGraphicsItem **)(lVar2 + 0x1a8);
  }
  else {
LAB_005d8a49:
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool QGraphicsItem::hasFocus() const
{
    if (!d_ptr->scene || !d_ptr->scene->isActive())
        return false;

    if (d_ptr->focusProxy)
        return d_ptr->focusProxy->hasFocus();

    if (d_ptr->scene->d_func()->focusItem != this)
        return false;

    return panel() == d_ptr->scene->d_func()->activePanel;
}